

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O3

void __thiscall TextBuffer::TextBuffer(TextBuffer *this)

{
  Layer *this_00;
  Text local_48;
  
  this_00 = (Layer *)operator_new(0xa0);
  Text::Text(&local_48);
  Layer::Layer(this_00,&local_48);
  if (local_48.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.line_offsets.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.line_offsets.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.line_offsets.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_48.content._M_dataplus._M_p != &local_48.content.field_2) {
    operator_delete(local_48.content._M_dataplus._M_p,
                    local_48.content.field_2._M_allocated_capacity * 2 + 2);
  }
  this->base_layer = this_00;
  this->top_layer = this_00;
  return;
}

Assistant:

TextBuffer::TextBuffer() :
  base_layer{new Layer(Text{})},
  top_layer{base_layer} {}